

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

void __thiscall
OpenMD::MoleculeCreator::createOverrideAtomTypes
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  AtomType *this_00;
  undefined8 *puVar4;
  AtomType *pAVar5;
  long lVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string atomTypeOverrideName;
  string baseType;
  ostringstream ss;
  FixedChargeAdapter local_238;
  long local_230;
  undefined1 local_228 [24];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_200;
  long local_1f0;
  AtomType *local_1e8 [2];
  pointer local_1d8;
  string local_1d0;
  MoleculeStamp *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  lVar7 = (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    paVar2 = &local_1a8[0].field_2;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar6 = 0;
    local_1b0 = molStamp;
    do {
      lVar3 = *(long *)((long)(local_1b0->atomStamps_).
                              super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + (lVar6 >> 0x1d));
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,*(long *)(lVar3 + 0x98),
                 *(long *)(lVar3 + 0xa0) + *(long *)(lVar3 + 0x98));
      this_00 = ForceField::getAtomType(ff,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (this_00 == (AtomType *)0x0) {
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,*(long *)(lVar3 + 0x98),
                   *(long *)(lVar3 + 0xa0) + *(long *)(lVar3 + 0x98));
        snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",
                 local_1a8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        painCave.isFatal = 1;
        simError();
      }
      if (*(char *)(lVar3 + 0xf2) == '\x01') {
        AtomType::getName_abi_cxx11_(&local_1d0,this_00);
        local_1d8 = *(pointer *)(lVar3 + 0xe8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<double>((double)local_1d8);
        local_238.at_ = (AtomType *)local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_1d0._M_dataplus._M_p,
                   local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
        std::__cxx11::string::append((char *)&local_238);
        std::__cxx11::stringbuf::str();
        pAVar5 = (AtomType *)0xf;
        if (local_238.at_ != (AtomType *)local_228) {
          pAVar5 = (AtomType *)local_228._0_8_;
        }
        if (pAVar5 < (AtomType *)(local_1f0 + local_230)) {
          pAVar5 = (AtomType *)0xf;
          if ((AtomType **)aStack_200._8_8_ != local_1e8) {
            pAVar5 = local_1e8[0];
          }
          if (pAVar5 < (AtomType *)(local_1f0 + local_230)) goto LAB_0016c12e;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((long)&aStack_200 + 8,0,(char *)0x0,(ulong)local_238.at_);
        }
        else {
LAB_0016c12e:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_238,aStack_200._8_8_);
        }
        local_228._16_8_ = &local_208;
        psVar1 = puVar4 + 2;
        if ((size_type *)*puVar4 == psVar1) {
          local_208 = *psVar1;
          aStack_200._M_allocated_capacity = puVar4[3];
        }
        else {
          local_208 = *psVar1;
          local_228._16_8_ = (size_type *)*puVar4;
        }
        local_210._M_p = (pointer)puVar4[1];
        *puVar4 = psVar1;
        puVar4[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((AtomType **)aStack_200._8_8_ != local_1e8) {
          operator_delete((void *)aStack_200._8_8_,(ulong)((long)&local_1e8[0]->_vptr_AtomType + 1))
          ;
        }
        if (local_238.at_ != (AtomType *)local_228) {
          operator_delete(local_238.at_,(ulong)((long)(_func_int ***)local_228._0_8_ + 1));
        }
        pAVar5 = ForceField::getAtomType(ff,(string *)(local_228 + 0x10));
        if (pAVar5 == (AtomType *)0x0) {
          pAVar5 = (AtomType *)operator_new(0xf8);
          AtomType::AtomType(pAVar5);
          (*pAVar5->_vptr_AtomType[2])(pAVar5,this_00);
          AtomType::setIdent(pAVar5,(int)(ff->atomTypeCont_).data_._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
          AtomType::setName(pAVar5,(string *)(local_228 + 0x10));
          ForceField::addAtomType(ff,(string *)(local_228 + 0x10),pAVar5);
          local_238.at_ = pAVar5;
          FixedChargeAdapter::makeFixedCharge
                    (&local_238,(double)local_1d8 * (ff->forceFieldOptions_).ChargeUnitScaling.data_
                    );
        }
        if ((size_type *)local_228._16_8_ != &local_208) {
          operator_delete((void *)local_228._16_8_,local_208 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
      }
      lVar6 = lVar6 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void MoleculeCreator::createOverrideAtomTypes(ForceField* ff,
						MoleculeStamp* molStamp) {

    // Some stamps have overrides of default types in the force field.
    // This runs through atomStamps which can have overrides and makes sure
    // that the types are created, even if this processor doesn't end up
    // owning that molecule:

    AtomStamp* stamp;
    size_t nAtom = molStamp->getNAtoms();
    
    for (size_t i = 0; i < nAtom; ++i) {
      stamp = molStamp->getAtomStamp(i);
      AtomType* atomType = ff->getAtomType(stamp->getType());
    
      if (atomType == NULL) {
	snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
		 "Can not find Matching Atom Type for[%s]",
		 stamp->getType().c_str());
	
	painCave.isFatal = 1;
	simError();
      }

      if (stamp->hasOverride()) {
	std::string baseType = atomType->getName();
	RealType oc          = stamp->getOverrideCharge();
	
	// Create a new atom type name that builds in the override charge:
	std::ostringstream ss;
	ss << oc;
	std::string atomTypeOverrideName = baseType + "_q=" + ss.str();
	
	// Maybe we've seen this before?
	
	AtomType* atB = ff->getAtomType(atomTypeOverrideName);
	
	if (atB == NULL) {
	  // Nope, we've never seen it before, so make a new one:
	  AtomType* atomTypeOverride = new AtomType();
	  // Base points to the atomType we already found
	  atomTypeOverride->useBase(atomType);
	  int ident = ff->getNAtomType();
	  atomTypeOverride->setIdent(ident);
	  atomTypeOverride->setName(atomTypeOverrideName);
	  ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
	  FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
	  RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
	  fca.makeFixedCharge(charge);
	} 
      }
    }    
  }